

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O0

int __thiscall Process::open(Process *this,char *__file,int __oflag,...)

{
  long lVar1;
  Process *this_00;
  ItemBlock *pIVar2;
  int iVar3;
  int *piVar4;
  long lVar5;
  String *pSVar6;
  int *extraout_RAX;
  ItemBlock *in_RCX;
  undefined8 uStack_150;
  undefined8 uStack_148;
  byte local_139;
  String *local_138;
  char *local_130;
  String *local_128;
  undefined1 local_119;
  Iterator *local_118;
  Iterator *local_110;
  usize local_108;
  undefined1 local_f9;
  List<String> *local_f8;
  Process *local_f0;
  Iterator local_e8;
  Iterator end;
  Iterator j;
  int i;
  char **argv;
  undefined1 local_90 [8];
  List<String> command;
  Map<String,_String> *environment_local;
  uint streams_local;
  String *commandLine_local;
  Process *this_local;
  
  local_f0 = this;
  command.blocks = in_RCX;
  if (this->pid == 0) {
    local_f8 = (List<String> *)local_90;
    uStack_150 = 0x105ed2;
    List<String>::List(local_f8);
    uStack_150 = 0x105ee2;
    Private::splitCommandLine((String *)__file,local_f8);
    uStack_150 = 0x105ef0;
    local_f9 = List<String>::isEmpty((List<String> *)local_90);
    if ((bool)local_f9) {
      uStack_150 = 0x105f10;
      String::String((String *)&argv);
      uStack_150 = 0x105f25;
      List<String>::append((List<String> *)local_90,(String *)&argv);
      uStack_150 = 0x105f33;
      String::~String((String *)&argv);
    }
    uStack_150 = 0x105f7b;
    local_108 = List<String>::size((List<String> *)local_90);
    lVar1 = -(local_108 * 8 + 0x17 & 0xfffffffffffffff0);
    lVar5 = (long)&uStack_148 + lVar1;
    j.item._4_4_ = 0;
    *(undefined8 *)((long)&uStack_150 + lVar1) = 0x105fbd;
    local_110 = List<String>::begin((List<String> *)local_90);
    end.item = local_110->item;
    *(undefined8 *)((long)&uStack_150 + lVar1) = 0x105fe3;
    local_118 = List<String>::end((List<String> *)local_90);
    local_e8.item = local_118->item;
    while( true ) {
      *(undefined8 *)((long)&uStack_150 + lVar1) = 0x106010;
      local_119 = List<String>::Iterator::operator!=(&end,&local_e8);
      if (!(bool)local_119) break;
      *(undefined8 *)((long)&uStack_150 + lVar1) = 0x106030;
      pSVar6 = List<String>::Iterator::operator*(&end);
      local_128 = pSVar6;
      *(undefined8 *)((long)&uStack_150 + lVar1) = 0x106045;
      local_130 = String::operator_cast_to_char_(pSVar6);
      *(char **)(lVar5 + (long)j.item._4_4_ * 8) = local_130;
      *(undefined8 *)((long)&uStack_150 + lVar1) = 0x106080;
      List<String>::Iterator::operator++(&end);
      j.item._4_4_ = j.item._4_4_ + 1;
    }
    *(undefined8 *)(lVar5 + (long)j.item._4_4_ * 8) = 0;
    *(undefined8 *)((long)&uStack_150 + lVar1) = 0x1060a9;
    pSVar6 = List<String>::front((List<String> *)local_90);
    pIVar2 = command.blocks;
    this_00 = local_f0;
    local_138 = pSVar6;
    *(undefined8 *)((long)&uStack_150 + lVar1) = 0x1060dc;
    iVar3 = open(this_00,(char *)pSVar6,j.item._4_4_ + 1,lVar5,(ulong)(uint)__oflag,pIVar2);
    local_139 = (byte)iVar3;
    this_local._7_1_ = local_139 & 1;
    *(undefined8 *)((long)&uStack_150 + lVar1) = 0x1060fb;
    List<String>::~List((List<String> *)local_90);
    piVar4 = extraout_RAX;
  }
  else {
    uStack_150 = 0x105eb0;
    piVar4 = __errno_location();
    *piVar4 = 0x16;
    this_local._7_1_ = 0;
  }
  return (int)CONCAT71((int7)((ulong)piVar4 >> 8),this_local._7_1_);
}

Assistant:

bool Process::open(const String& commandLine, uint streams, const Map<String, String>& environment)
{
#ifdef _WIN32
  if(hProcess != INVALID_HANDLE_VALUE)
  {
    SetLastError(ERROR_INVALID_HANDLE);
    return false;
  }

  STARTUPINFO si;
  PROCESS_INFORMATION pi;

  ZeroMemory(&si, sizeof(si));
  si.cb = sizeof(si);
  ZeroMemory(&pi, sizeof(pi));

  si.dwFlags = STARTF_USESTDHANDLES;
  si.hStdInput = INVALID_HANDLE_VALUE;
  si.hStdOutput = INVALID_HANDLE_VALUE;
  si.hStdError = INVALID_HANDLE_VALUE;

  SECURITY_ATTRIBUTES sa; 
  sa.nLength = sizeof(SECURITY_ATTRIBUTES); 
  sa.bInheritHandle = TRUE; 
  sa.lpSecurityDescriptor = NULL; 

  if(streams & stdoutStream)
  {
   if(!CreatePipe(&hStdOutRead, &si.hStdOutput, &sa, 0) ||
      !SetHandleInformation(hStdOutRead, HANDLE_FLAG_INHERIT, 0))
      goto error;
  }
  else
    si.hStdOutput = GetStdHandle(STD_OUTPUT_HANDLE);
  if(streams & stderrStream)
  {
   if(!CreatePipe(&hStdErrRead, &si.hStdError, &sa, 0) ||
      !SetHandleInformation(hStdErrRead, HANDLE_FLAG_INHERIT, 0))
      goto error;
  }
  else
    si.hStdError = GetStdHandle(STD_ERROR_HANDLE);
  if(streams & stdinStream)
  {
   if(!CreatePipe(&si.hStdInput, &hStdInWrite, &sa, 0) ||
      !SetHandleInformation(hStdInWrite, HANDLE_FLAG_INHERIT, 0))
      goto error;
  }
  else
    si.hStdInput = GetStdHandle(STD_INPUT_HANDLE);



  {
    Buffer envBuffer;
    LPTSTR env = prepareEnvironment(environment, envBuffer);

    String args(commandLine);
    if(!CreateProcess(NULL, (char*)args, NULL, NULL, TRUE, 0, env, NULL, &si, &pi))
      goto error;
  }

  CloseHandle(pi.hThread);

  if(streams & stdoutStream && si.hStdOutput != INVALID_HANDLE_VALUE)
    CloseHandle(si.hStdOutput);
  if(streams & stderrStream && si.hStdError != INVALID_HANDLE_VALUE)
    CloseHandle(si.hStdError);
  if(streams & stdinStream && si.hStdInput != INVALID_HANDLE_VALUE)
    CloseHandle(si.hStdInput);

  ASSERT(pi.hProcess);
  hProcess = pi.hProcess;
  pid = pi.dwProcessId;
  return true;
error:
  DWORD err = GetLastError();
  if(hStdOutRead != INVALID_HANDLE_VALUE)
  {
    CloseHandle(hStdOutRead);
    hStdOutRead = INVALID_HANDLE_VALUE;
  }
  if(hStdErrRead != INVALID_HANDLE_VALUE)
  {
    CloseHandle(hStdErrRead);
    hStdErrRead = INVALID_HANDLE_VALUE;
  }
  if(hStdInWrite != INVALID_HANDLE_VALUE)
  {
    CloseHandle(hStdInWrite);
    hStdInWrite = INVALID_HANDLE_VALUE;
  }
  if(streams & stdoutStream && si.hStdOutput != INVALID_HANDLE_VALUE)
    CloseHandle(si.hStdOutput);
  if(streams & stderrStream && si.hStdError != INVALID_HANDLE_VALUE)
    CloseHandle(si.hStdError);
  if(streams & stdinStream && si.hStdInput != INVALID_HANDLE_VALUE)
    CloseHandle(si.hStdInput);
  SetLastError(err);
  return false;
#else
  if(pid)
  {
    errno = EINVAL;
    return false;
  }

  List<String> command;
  Private::splitCommandLine(commandLine, command);
  if(command.isEmpty())
    command.append(String());

  char** argv = (char**)alloca(sizeof(char*) * (command.size() + 1));
  int i = 0;
  for (List<String>::Iterator j = command.begin(), end = command.end(); j != end; ++j)
    argv[i++] = (char*)(const char*)*j;
  argv[i] = 0;
  return open(command.front(), i + 1, argv, streams, environment);
#endif
}